

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

int __thiscall jbcoin::STTx::sign(STTx *this,PublicKey *publicKey,SecretKey *secretKey)

{
  int extraout_EAX;
  Buffer sig;
  Blob data;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_68;
  size_t local_60;
  uint256 local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  getSigningData((Blob *)&local_38,this);
  local_58.pn._8_8_ =
       (long)local_38._M_impl.super__Vector_impl_data._M_finish -
       (long)local_38._M_impl.super__Vector_impl_data._M_start;
  local_58.pn._0_8_ = local_38._M_impl.super__Vector_impl_data._M_start;
  jbcoin::sign((jbcoin *)&local_68,publicKey,secretKey,(Slice *)&local_58);
  local_58.pn[2] = (undefined4)local_60;
  local_58.pn[3] = local_60._4_4_;
  STObject::setFieldVL(&this->super_STObject,(SField *)sfTxnSignature,(Slice *)&local_58);
  STObject::getHash(&local_58,&this->super_STObject,HashPrefix::transactionID);
  base_uint<256UL,_void>::operator=(&this->tid_,&local_58);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return extraout_EAX;
}

Assistant:

void STTx::sign (
    PublicKey const& publicKey,
    SecretKey const& secretKey)
{
    auto const data = getSigningData (*this);

    auto const sig = jbcoin::sign (
        publicKey,
        secretKey,
        makeSlice(data));

    setFieldVL (sfTxnSignature, sig);
    tid_ = getHash(HashPrefix::transactionID);
}